

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::ResizeIfLoadIsOutOfRange(InnerMap *this,size_type new_size)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  size_t new_num_buckets;
  
  uVar1 = this->num_buckets_;
  uVar3 = uVar1 * 0xc >> 4;
  if (new_size < uVar3) {
    if (8 < uVar1 && new_size <= uVar1 * 0xc >> 6) {
      bVar2 = 0;
      do {
        bVar2 = bVar2 + 1;
      } while (new_size + (new_size >> 2) + 1 << (bVar2 & 0x3f) < uVar3);
      uVar3 = uVar1 >> (bVar2 & 0x3f);
      new_num_buckets = 8;
      if (8 < uVar3) {
        new_num_buckets = uVar3;
      }
      if (new_num_buckets != uVar1) goto LAB_0028f65a;
    }
  }
  else if (uVar1 < 0x800000000000001) {
    new_num_buckets = uVar1 * 2;
LAB_0028f65a:
    Resize(this,new_num_buckets);
    return true;
  }
  return false;
}

Assistant:

bool ResizeIfLoadIsOutOfRange(size_type new_size) {
      const size_type kMaxMapLoadTimes16 = 12;  // controls RAM vs CPU tradeoff
      const size_type hi_cutoff = num_buckets_ * kMaxMapLoadTimes16 / 16;
      const size_type lo_cutoff = hi_cutoff / 4;
      // We don't care how many elements are in trees.  If a lot are,
      // we may resize even though there are many empty buckets.  In
      // practice, this seems fine.
      if (PROTOBUF_PREDICT_FALSE(new_size >= hi_cutoff)) {
        if (num_buckets_ <= max_size() / 2) {
          Resize(num_buckets_ * 2);
          return true;
        }
      } else if (PROTOBUF_PREDICT_FALSE(new_size <= lo_cutoff &&
                                        num_buckets_ > kMinTableSize)) {
        size_type lg2_of_size_reduction_factor = 1;
        // It's possible we want to shrink a lot here... size() could even be 0.
        // So, estimate how much to shrink by making sure we don't shrink so
        // much that we would need to grow the table after a few inserts.
        const size_type hypothetical_size = new_size * 5 / 4 + 1;
        while ((hypothetical_size << lg2_of_size_reduction_factor) <
               hi_cutoff) {
          ++lg2_of_size_reduction_factor;
        }
        size_type new_num_buckets = std::max<size_type>(
            kMinTableSize, num_buckets_ >> lg2_of_size_reduction_factor);
        if (new_num_buckets != num_buckets_) {
          Resize(new_num_buckets);
          return true;
        }
      }
      return false;
    }